

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

walk_result __thiscall
jsoncons::jsonschema::
min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_6)

{
  ulong __val;
  char cVar1;
  bool bVar2;
  walk_result wVar3;
  size_t sVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  size_t sVar8;
  char cVar9;
  string __str_1;
  string __str;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  uint local_198;
  long local_190 [2];
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  long *local_148;
  long local_138 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long *local_a0;
  long local_90 [2];
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (instance);
  if (!bVar2) {
    return advance;
  }
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&local_68,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .keyword_name_);
  sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size(instance)
  ;
  __val = *(ulong *)&(this->
                     super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     ).field_0xe0;
  if (sVar4 < __val) {
    cVar9 = '\x01';
    if (9 < __val) {
      uVar6 = __val;
      cVar1 = '\x04';
      do {
        cVar9 = cVar1;
        if (uVar6 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_004713f4;
        }
        if (uVar6 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_004713f4;
        }
        if (uVar6 < 10000) goto LAB_004713f4;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar1 = cVar9 + '\x04';
      } while (bVar2);
      cVar9 = cVar9 + '\x01';
    }
LAB_004713f4:
    local_180 = &local_170;
    std::__cxx11::string::_M_construct((ulong)&local_180,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_180,(uint)local_178,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,0x89743c);
    local_1c0 = &local_1b0;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_1b0 = *plVar7;
      lStack_1a8 = plVar5[3];
    }
    else {
      local_1b0 = *plVar7;
      local_1c0 = (long *)*plVar5;
    }
    local_1b8 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    sVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                      (instance);
    cVar9 = '\x01';
    if (9 < sVar4) {
      sVar8 = sVar4;
      cVar1 = '\x04';
      do {
        cVar9 = cVar1;
        if (sVar8 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_004714fe;
        }
        if (sVar8 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_004714fe;
        }
        if (sVar8 < 10000) goto LAB_004714fe;
        bVar2 = 99999 < sVar8;
        sVar8 = sVar8 / 10000;
        cVar1 = cVar9 + '\x04';
      } while (bVar2);
      cVar9 = cVar9 + '\x01';
    }
LAB_004714fe:
    local_1a0 = local_190;
    std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1a0,local_198,sVar4);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x8978c6);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_170 = *plVar7;
      lStack_168 = plVar5[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar7;
      local_180 = (long *)*plVar5;
    }
    local_178 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1a0 != local_190) {
      operator_delete(local_1a0,local_190[0] + 1);
    }
    (*(this->
      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).
      super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      .super_validation_message_factory._vptr_validation_message_factory[2])
              (&local_180,this,&local_68.eval_path_,instance_location,&local_1c0);
    reporter->error_count_ = reporter->error_count_ + 1;
    wVar3 = (*reporter->_vptr_error_reporter[2])(reporter,&local_180);
    std::
    vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
    ::~vector(&local_80);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    if (local_148 != local_138) {
      operator_delete(local_148,local_138[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    if (wVar3 == abort) goto LAB_004716aa;
  }
  wVar3 = advance;
LAB_004716aa:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.eval_path_.tokens_);
  if (local_68.dynamic_scope_.
      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.dynamic_scope_.
                    super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return wVar3;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.size() < min_items_)
            {
                std::string message("Minimum number of items is " + std::to_string(min_items_));
                message.append(" but found " + std::to_string(instance.size()));
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }          
            return walk_result::advance;
        }